

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O3

void __thiscall
slang::ast::ForwardingTypedefSymbol::serializeTo
          (ForwardingTypedefSymbol *this,ASTSerializer *serializer)

{
  size_t __n;
  
  __n = strlen(*(char **)(toString(slang::ast::ForwardTypeRestriction)::strings +
                         (long)(int)this->typeRestriction * 8));
  ASTSerializer::write(serializer,8,"category",__n);
  if (this->next != (ForwardingTypedefSymbol *)0x0) {
    ASTSerializer::write(serializer,4,"next",(size_t)this->next);
    return;
  }
  return;
}

Assistant:

void ForwardingTypedefSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("category", toString(typeRestriction));
    if (next)
        serializer.write("next", *next);
}